

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::NullEventPort::wake(NullEventPort *this)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [78];
  String local_188;
  Exception local_168;
  
  Debug::makeDescription<char_const(&)[78]>
            (&local_188,
             (Debug *)
             "\"Cross-thread events are not yet implemented for EventLoops with no EventPort.\"",
             "Cross-thread events are not yet implemented for EventLoops with no EventPort.",in_RCX)
  ;
  Exception::Exception
            (&local_168,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x11a,&local_188);
  throwRecoverableException(&local_168,0);
  Exception::~Exception(&local_168);
  sVar2 = local_188.content.size_;
  pcVar1 = local_188.content.ptr;
  if (local_188.content.ptr != (char *)0x0) {
    local_188.content.ptr = (char *)0x0;
    local_188.content.size_ = 0;
    (**(local_188.content.disposer)->_vptr_ArrayDisposer)
              (local_188.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void wake() const override {
    // TODO(someday): Implement using condvar.
    kj::throwRecoverableException(KJ_EXCEPTION(UNIMPLEMENTED,
        "Cross-thread events are not yet implemented for EventLoops with no EventPort."));
  }